

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_0::TestCase1772::run::MockEventPort::poll
          (MockEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  PromiseFulfiller<void> *pPVar1;
  char c;
  char local_29;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_28;
  
  this->pollStack = &local_29;
  pPVar1 = (this->fulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    local_28.disposer = (Disposer *)0x0;
    local_28.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=(&(this->fulfiller).ptr,&local_28);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_28);
  }
  return 0;
}

Assistant:

bool poll() override {
      char c;
      pollStack = &c;
      KJ_IF_SOME(f, fulfiller) {
        f->fulfill();
        fulfiller = kj::none;
      }
      return false;
    }